

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_13792d8::ObmcVarianceTest_ExtremeValues_Test::TestBody
          (ObmcVarianceTest_ExtremeValues_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  uint tst_res;
  uint ref_res;
  uint tst_sse;
  uint ref_sse;
  int i;
  int pre_stride;
  int iter;
  int32_t mask [16384];
  int32_t wsrc [16384];
  uint8_t pre [16384];
  AssertHelper *in_stack_fffffffffffdbf08;
  uint *in_stack_fffffffffffdbf10;
  uint in_stack_fffffffffffdbf1c;
  char *in_stack_fffffffffffdbf28;
  Type in_stack_fffffffffffdbf34;
  AssertHelper *in_stack_fffffffffffdbf38;
  AssertionResult aAStack_240a0 [2];
  Message *in_stack_fffffffffffdbf80;
  AssertHelper *in_stack_fffffffffffdbf88;
  undefined1 auStack_24054 [4];
  undefined1 auStack_24050 [4];
  int iStack_2404c;
  int iStack_24048;
  int iStack_24044;
  undefined4 auStack_24040 [16384];
  undefined4 auStack_14040 [16384];
  undefined1 local_4040 [16440];
  
  iStack_24044 = 0;
  while( true ) {
    in_stack_fffffffffffdbf1c = in_stack_fffffffffffdbf1c & 0xffffff;
    if (iStack_24044 < 0x80) {
      bVar1 = testing::Test::HasFatalFailure();
      in_stack_fffffffffffdbf1c = CONCAT13(bVar1,(int3)in_stack_fffffffffffdbf1c) ^ 0xff000000;
    }
    if ((in_stack_fffffffffffdbf1c & 0x1000000) == 0) {
      return;
    }
    iStack_24048 = iStack_24044;
    for (iStack_2404c = 0; iStack_2404c < 0x4000; iStack_2404c = iStack_2404c + 1) {
      local_4040[iStack_2404c] = 0xff;
      auStack_14040[iStack_2404c] = 0xff000;
      auStack_24040[iStack_2404c] = 0x1000;
    }
    (**(code **)(in_RDI + 0x20))(local_4040,iStack_24044,auStack_14040,auStack_24040,auStack_24050);
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)&stack0xfffffffffffdbf86);
    uVar2 = (**(code **)(in_RDI + 0x28))
                      (local_4040,iStack_24048,auStack_14040,auStack_24040,auStack_24054);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xbdd80f);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              (in_RDI,(char *)CONCAT44(in_stack_fffffffffffdbf1c,uVar2),in_stack_fffffffffffdbf10,
               (uint *)in_stack_fffffffffffdbf08);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(aAStack_240a0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffdbf38);
      in_stack_fffffffffffdbf10 =
           (uint *)testing::AssertionResult::failure_message((AssertionResult *)0xbdd882);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffdbf38,in_stack_fffffffffffdbf34,in_stack_fffffffffffdbf28,
                 (int)((ulong)in_RDI >> 0x20),(char *)CONCAT44(in_stack_fffffffffffdbf1c,uVar2));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffdbf88,in_stack_fffffffffffdbf80);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffdbf08);
      testing::Message::~Message((Message *)0xbdd8d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbdd933);
    if (!bVar1) break;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              (in_RDI,(char *)CONCAT44(in_stack_fffffffffffdbf1c,uVar2),in_stack_fffffffffffdbf10,
               (uint *)in_stack_fffffffffffdbf08);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffdbf38);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffdbf38);
      in_stack_fffffffffffdbf08 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xbdd9a4);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffdbf38,in_stack_fffffffffffdbf34,in_stack_fffffffffffdbf28,
                 (int)((ulong)in_RDI >> 0x20),(char *)CONCAT44(in_stack_fffffffffffdbf1c,uVar2));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffdbf88,in_stack_fffffffffffdbf80);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffdbf08);
      testing::Message::~Message((Message *)0xbdd9f2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbdda52);
    if (!bVar1) {
      return;
    }
    iStack_24044 = iStack_24044 + 1;
  }
  return;
}

Assistant:

TEST_P(ObmcVarianceTest, ExtremeValues) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < MAX_SB_SIZE && !HasFatalFailure(); ++iter) {
    const int pre_stride = iter;

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = UINT8_MAX;
      wsrc[i] = UINT8_MAX * kMaskMax * kMaskMax;
      mask[i] = kMaskMax * kMaskMax;
    }

    unsigned int ref_sse, tst_sse;
    const unsigned int ref_res =
        params_.ref_func(pre, pre_stride, wsrc, mask, &ref_sse);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(
        tst_res = params_.tst_func(pre, pre_stride, wsrc, mask, &tst_sse));

    ASSERT_EQ(ref_res, tst_res);
    ASSERT_EQ(ref_sse, tst_sse);
  }
}